

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Document::parseDirectives(Document *this)

{
  pointer pcVar1;
  TokenKind TVar2;
  bool bVar3;
  Token *pTVar4;
  bool bVar5;
  Token T;
  long *local_50 [2];
  long local_40 [3];
  
  bVar5 = false;
  do {
    pTVar4 = Scanner::peekNext((Scanner *)
                               (this->stream->scanner)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                               .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    TVar2 = pTVar4->Kind;
    pcVar1 = (pTVar4->Value)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + (pTVar4->Value)._M_string_length);
    if (TVar2 == TK_VersionDirective) {
      parseYAMLDirective(this);
LAB_0018e7c1:
      bVar5 = true;
      bVar3 = true;
    }
    else {
      if (TVar2 == TK_TagDirective) {
        parseTAGDirective(this);
        goto LAB_0018e7c1;
      }
      bVar3 = false;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (!bVar3) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool Document::parseDirectives() {
  bool isDirective = false;
  while (true) {
    Token T = peekNext();
    if (T.Kind == Token::TK_TagDirective) {
      parseTAGDirective();
      isDirective = true;
    } else if (T.Kind == Token::TK_VersionDirective) {
      parseYAMLDirective();
      isDirective = true;
    } else
      break;
  }
  return isDirective;
}